

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<unsigned_int> *
wasm::WATParser::tupleArity<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  Lexer *pLVar2;
  uint *puVar3;
  allocator<char> local_b9;
  string local_b8;
  Err local_98;
  allocator<char> local_61;
  string local_60;
  Err local_40;
  _Optional_payload_base<unsigned_int> local_20;
  optional<unsigned_int> arity;
  ParseDefsCtx *ctx_local;
  
  arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(_Optional_base<unsigned_int,_true,_true>)ctx;
  local_20 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_20);
  if (bVar1) {
    puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
    if (*puVar3 < 2) {
      pLVar2 = (Lexer *)((long)arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int> + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"tuple arity must be at least 2",&local_b9);
      Lexer::err(&local_98,pLVar2,&local_b8);
      Result<unsigned_int>::Result(__return_storage_ptr__,&local_98);
      wasm::Err::~Err(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    else {
      puVar3 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_20);
      Result<unsigned_int>::Result<unsigned_int&>(__return_storage_ptr__,puVar3);
    }
  }
  else {
    pLVar2 = (Lexer *)((long)arity.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int> + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"expected tuple arity",&local_61);
    Lexer::err(&local_40,pLVar2,&local_60);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> tupleArity(Ctx& ctx) {
  auto arity = ctx.in.takeU32();
  if (!arity) {
    return ctx.in.err("expected tuple arity");
  }
  if (*arity < 2) {
    return ctx.in.err("tuple arity must be at least 2");
  }
  return *arity;
}